

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

natwm_error config_find_string(map *config_map,char *key,char **result)

{
  natwm_error nVar1;
  config_value *pcVar2;
  
  pcVar2 = config_find(config_map,key);
  if (pcVar2 == (config_value *)0x0) {
    nVar1 = NOT_FOUND_ERROR;
  }
  else if (pcVar2->type == STRING) {
    *result = (char *)pcVar2->data;
    nVar1 = NO_ERROR;
  }
  else {
    nVar1 = INVALID_INPUT_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error config_find_string(const struct map *config_map, const char *key,
                                    const char **result)
{
        struct config_value *value = config_find(config_map, key);

        if (value == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (value->type != STRING) {
                return INVALID_INPUT_ERROR;
        }

        *result = value->data.string;

        return NO_ERROR;
}